

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,Recycler *recycler,int slotCapacity,
          uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots)

{
  Recycler *pRVar1;
  IndexPropertyDescriptorMap *this_00;
  TrackAllocData local_48;
  uint16 local_20;
  uint16 local_1e;
  int local_1c;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int slotCapacity_local;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  local_20 = offsetOfInlineSlots;
  local_1e = inlineSlotCapacity;
  local_1c = slotCapacity;
  _offsetOfInlineSlots_local = recycler;
  recycler_local = (Recycler *)this;
  DictionaryTypeHandlerBase<unsigned_short>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<unsigned_short>,recycler,slotCapacity,
             inlineSlotCapacity,offsetOfInlineSlots);
  (this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
  _vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e46e88;
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::WriteBarrierPtr(&this->indexPropertyMap);
  pRVar1 = _offsetOfInlineSlots_local;
  this->dataItemAttributes = '\a';
  this->lengthWritable = true;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&IndexPropertyDescriptorMap::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0xe6);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(this_00,_offsetOfInlineSlots_local);
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator=
            (&this->indexPropertyMap,this_00);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler, int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots)
        : DictionaryTypeHandlerBase<T>(recycler, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots), dataItemAttributes(PropertyDynamicTypeDefaults), lengthWritable(true)
    {
        indexPropertyMap = RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler);
    }